

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# submit-2AddPointBeforeQueryPolygon.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> *
QueryPolygonFromAddPointBeforeQueryPolygon
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,int n,
          vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *polygon)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  int i;
  pair<double,_double> *ppVar6;
  int *__x;
  double local_a8;
  double dStack_a0;
  GridSet_conflict grid_set;
  
  if (ans.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish !=
      ans.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start) {
    ans.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         ans.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  }
  lVar4 = 0;
  uVar5 = 0;
  if (0 < n) {
    uVar5 = (ulong)(uint)n;
  }
  for (; uVar5 * 0x10 != lVar4; lVar4 = lVar4 + 0x10) {
    puVar1 = (undefined8 *)
             ((long)&((polygon->
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      )._M_impl.super__Vector_impl_data._M_start)->first + lVar4);
    uVar2 = puVar1[1];
    *(undefined8 *)((long)pgon[0] + lVar4) = *puVar1;
    *(undefined8 *)((long)pgon[0] + lVar4 + 8) = uVar2;
  }
  GridSetup(pgon,n,100,&grid_set);
  __x = Point_id;
  ppVar6 = Point;
  for (lVar4 = 0; lVar4 < Point_cnt; lVar4 = lVar4 + 1) {
    local_a8 = ppVar6->first;
    dStack_a0 = ppVar6->second;
    iVar3 = GridTest(&grid_set,&local_a8);
    if (iVar3 != 0) {
      std::vector<int,_std::allocator<int>_>::push_back(&ans,__x);
    }
    __x = __x + 1;
    ppVar6 = ppVar6 + 1;
  }
  GridCleanup(&grid_set);
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,&ans);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> QueryPolygonFromAddPointBeforeQueryPolygon(int n, std::vector<std::pair<double, double> > polygon) {
    ans.clear();
    GridSet grid_set;
    for (int i = 0; i < n; i++)
        pgon[i][0] = polygon[i].first,
        pgon[i][1] = polygon[i].second;
    GridSetup(pgon, n, Grid_Resolution, &grid_set);
    for (int i = 0; i<Point_cnt ; i++) {
        double point[2];
        point[0] = Point[i].first, point[1] = Point[i].second;
        if (GridTest(&grid_set, point))
            ans.push_back(Point_id[i]);
    }
    GridCleanup(&grid_set);
    return ans;
}